

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O2

void __thiscall Centaurus::ChaserEM64T<char>::ChaserEM64T(ChaserEM64T<char> *this)

{
  (this->super_IChaser)._vptr_IChaser = (_func_int **)&PTR__ChaserEM64T_0019f5e0;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  asmjit::CodeHolder::CodeHolder(&this->m_code);
  (this->m_funcmap)._M_h._M_buckets = &(this->m_funcmap)._M_h._M_single_bucket;
  (this->m_funcmap)._M_h._M_bucket_count = 1;
  (this->m_funcmap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_funcmap)._M_h._M_element_count = 0;
  (this->m_funcmap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_funcarray).
  super__Vector_base<void_*(*)(void_*,_const_void_*),_std::allocator<void_*(*)(void_*,_const_void_*)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [32])&(this->m_funcmap)._M_h._M_rehash_policy._M_next_resize = ZEXT432(0) << 0x40
  ;
  return;
}

Assistant:

ChaserEM64T() {}